

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParseVisibilityTest_Edition2024NonStrictLocalMessage_Test::TestBody
          (ParseVisibilityTest_Edition2024NonStrictLocalMessage_Test *this)

{
  ParserTest::ExpectParsesTo
            (&this->super_ParseVisibilityTest,
             "\n        edition = \"2024\";\n        local message B {\n          export enum NestedEnum {\n            B_VAL = 0;\n          }\n          local message NestedMessage {\n          }\n        }\n        "
             ,
             "message_type {\n             name: \"B\"\n             enum_type {\n               name: \"NestedEnum\"\n               value { name: \"B_VAL\" number: 0 }\n               visibility: VISIBILITY_EXPORT\n             }\n             nested_type { name: \"NestedMessage\" visibility: VISIBILITY_LOCAL }\n             visibility: VISIBILITY_LOCAL\n           }\n           syntax: \"editions\"\n           edition: EDITION_2024\n      "
            );
  return;
}

Assistant:

TEST_F(ParseVisibilityTest, Edition2024NonStrictLocalMessage) {
  ExpectParsesTo(
      R"schema(
        edition = "2024";
        local message B {
          export enum NestedEnum {
            B_VAL = 0;
          }
          local message NestedMessage {
          }
        }
        )schema",
      R"pb(message_type {
             name: "B"
             enum_type {
               name: "NestedEnum"
               value { name: "B_VAL" number: 0 }
               visibility: VISIBILITY_EXPORT
             }
             nested_type { name: "NestedMessage" visibility: VISIBILITY_LOCAL }
             visibility: VISIBILITY_LOCAL
           }
           syntax: "editions"
           edition: EDITION_2024
      )pb");
}